

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcoefct.c
# Opt level: O0

int decompress_onepass(j_decompress_ptr cinfo,JSAMPIMAGE output_buf)

{
  JDIMENSION JVar1;
  JDIMENSION JVar2;
  int iVar3;
  jpeg_d_coef_controller *pjVar4;
  jpeg_component_info *pjVar5;
  inverse_DCT_method_ptr p_Var6;
  uint uVar7;
  boolean bVar8;
  long in_RSI;
  j_decompress_ptr in_RDI;
  inverse_DCT_method_ptr inverse_DCT;
  jpeg_component_info *compptr;
  JDIMENSION output_col;
  JDIMENSION start_col;
  JSAMPARRAY output_ptr;
  int useful_width;
  int yoffset;
  int yindex;
  int xindex;
  int ci;
  int blkn;
  JDIMENSION last_iMCU_row;
  JDIMENSION last_MCU_col;
  JDIMENSION MCU_col_num;
  my_coef_ptr_conflict coef;
  size_t in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  int iVar9;
  JDIMENSION local_58;
  JSAMPARRAY local_50;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  uint local_24;
  int local_4;
  
  pjVar4 = in_RDI->coef;
  uVar7 = in_RDI->MCUs_per_row - 1;
  JVar1 = in_RDI->total_iMCU_rows;
  local_40 = *(int *)((long)&pjVar4[1].start_input_pass + 4);
  do {
    if (*(int *)&pjVar4[1].consume_data <= local_40) {
      in_RDI->output_iMCU_row = in_RDI->output_iMCU_row + 1;
      uVar7 = in_RDI->input_iMCU_row + 1;
      in_RDI->input_iMCU_row = uVar7;
      if (uVar7 < in_RDI->total_iMCU_rows) {
        start_iMCU_row(in_RDI);
        local_4 = 3;
      }
      else {
        (*in_RDI->inputctl->finish_input_pass)(in_RDI);
        local_4 = 4;
      }
      return local_4;
    }
    for (local_24 = *(uint *)&pjVar4[1].start_input_pass; local_24 <= uVar7; local_24 = local_24 + 1
        ) {
      jzero_far((void *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                in_stack_ffffffffffffff88);
      if (in_RDI->entropy->insufficient_data == 0) {
        in_RDI->master->last_good_iMCU_row = in_RDI->input_iMCU_row;
      }
      bVar8 = (*in_RDI->entropy->decode_mcu)(in_RDI,(JBLOCKROW *)&pjVar4[1].start_output_pass);
      if (bVar8 == 0) {
        *(int *)((long)&pjVar4[1].start_input_pass + 4) = local_40;
        *(uint *)&pjVar4[1].start_input_pass = local_24;
        return 0;
      }
      if ((in_RDI->master->first_iMCU_col <= local_24) &&
         (local_24 <= in_RDI->master->last_iMCU_col)) {
        local_30 = 0;
        for (local_34 = 0; local_34 < in_RDI->comps_in_scan; local_34 = local_34 + 1) {
          pjVar5 = in_RDI->cur_comp_info[local_34];
          if (pjVar5->component_needed == 0) {
            local_30 = pjVar5->MCU_blocks + local_30;
          }
          else {
            p_Var6 = in_RDI->idct->inverse_DCT[pjVar5->component_index];
            if (local_24 < uVar7) {
              iVar9 = pjVar5->MCU_width;
            }
            else {
              iVar9 = pjVar5->last_col_width;
            }
            local_50 = (JSAMPARRAY)
                       (*(long *)(in_RSI + (long)pjVar5->component_index * 8) +
                       (long)(local_40 * pjVar5->DCT_scaled_size) * 8);
            JVar2 = in_RDI->master->first_iMCU_col;
            iVar3 = pjVar5->MCU_sample_width;
            in_stack_ffffffffffffff94 = iVar9;
            for (local_3c = 0; local_3c < pjVar5->MCU_height; local_3c = local_3c + 1) {
              if ((in_RDI->input_iMCU_row < JVar1 - 1) ||
                 (local_40 + local_3c < pjVar5->last_row_height)) {
                local_58 = (local_24 - JVar2) * iVar3;
                for (local_38 = 0; local_38 < iVar9; local_38 = local_38 + 1) {
                  (*p_Var6)(in_RDI,pjVar5,
                            (JCOEFPTR)(&pjVar4[1].start_output_pass)[local_30 + local_38],local_50,
                            local_58);
                  local_58 = pjVar5->DCT_scaled_size + local_58;
                }
              }
              local_30 = pjVar5->MCU_width + local_30;
              local_50 = local_50 + pjVar5->DCT_scaled_size;
            }
          }
        }
      }
    }
    *(undefined4 *)&pjVar4[1].start_input_pass = 0;
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

METHODDEF(int)
decompress_onepass(j_decompress_ptr cinfo, JSAMPIMAGE output_buf)
{
  my_coef_ptr coef = (my_coef_ptr)cinfo->coef;
  JDIMENSION MCU_col_num;       /* index of current MCU within row */
  JDIMENSION last_MCU_col = cinfo->MCUs_per_row - 1;
  JDIMENSION last_iMCU_row = cinfo->total_iMCU_rows - 1;
  int blkn, ci, xindex, yindex, yoffset, useful_width;
  JSAMPARRAY output_ptr;
  JDIMENSION start_col, output_col;
  jpeg_component_info *compptr;
  inverse_DCT_method_ptr inverse_DCT;

  /* Loop to process as much as one whole iMCU row */
  for (yoffset = coef->MCU_vert_offset; yoffset < coef->MCU_rows_per_iMCU_row;
       yoffset++) {
    for (MCU_col_num = coef->MCU_ctr; MCU_col_num <= last_MCU_col;
         MCU_col_num++) {
      /* Try to fetch an MCU.  Entropy decoder expects buffer to be zeroed. */
      jzero_far((void *)coef->MCU_buffer[0],
                (size_t)(cinfo->blocks_in_MCU * sizeof(JBLOCK)));
      if (!cinfo->entropy->insufficient_data)
        cinfo->master->last_good_iMCU_row = cinfo->input_iMCU_row;
      if (!(*cinfo->entropy->decode_mcu) (cinfo, coef->MCU_buffer)) {
        /* Suspension forced; update state counters and exit */
        coef->MCU_vert_offset = yoffset;
        coef->MCU_ctr = MCU_col_num;
        return JPEG_SUSPENDED;
      }

      /* Only perform the IDCT on blocks that are contained within the desired
       * cropping region.
       */
      if (MCU_col_num >= cinfo->master->first_iMCU_col &&
          MCU_col_num <= cinfo->master->last_iMCU_col) {
        /* Determine where data should go in output_buf and do the IDCT thing.
         * We skip dummy blocks at the right and bottom edges (but blkn gets
         * incremented past them!).  Note the inner loop relies on having
         * allocated the MCU_buffer[] blocks sequentially.
         */
        blkn = 0;               /* index of current DCT block within MCU */
        for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
          compptr = cinfo->cur_comp_info[ci];
          /* Don't bother to IDCT an uninteresting component. */
          if (!compptr->component_needed) {
            blkn += compptr->MCU_blocks;
            continue;
          }
          inverse_DCT = cinfo->idct->inverse_DCT[compptr->component_index];
          useful_width = (MCU_col_num < last_MCU_col) ?
                         compptr->MCU_width : compptr->last_col_width;
          output_ptr = output_buf[compptr->component_index] +
                       yoffset * compptr->_DCT_scaled_size;
          start_col = (MCU_col_num - cinfo->master->first_iMCU_col) *
                      compptr->MCU_sample_width;
          for (yindex = 0; yindex < compptr->MCU_height; yindex++) {
            if (cinfo->input_iMCU_row < last_iMCU_row ||
                yoffset + yindex < compptr->last_row_height) {
              output_col = start_col;
              for (xindex = 0; xindex < useful_width; xindex++) {
                (*inverse_DCT) (cinfo, compptr,
                                (JCOEFPTR)coef->MCU_buffer[blkn + xindex],
                                output_ptr, output_col);
                output_col += compptr->_DCT_scaled_size;
              }
            }
            blkn += compptr->MCU_width;
            output_ptr += compptr->_DCT_scaled_size;
          }
        }
      }
    }
    /* Completed an MCU row, but perhaps not an iMCU row */
    coef->MCU_ctr = 0;
  }
  /* Completed the iMCU row, advance counters for next one */
  cinfo->output_iMCU_row++;
  if (++(cinfo->input_iMCU_row) < cinfo->total_iMCU_rows) {
    start_iMCU_row(cinfo);
    return JPEG_ROW_COMPLETED;
  }
  /* Completed the scan */
  (*cinfo->inputctl->finish_input_pass) (cinfo);
  return JPEG_SCAN_COMPLETED;
}